

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O2

void p_hash_table_remove(PHashTable *table,pconstpointer key)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  PHashTableNode *pPVar3;
  PHashTableNode *pPVar4;
  PHashTableNode *pPVar5;
  
  if (table != (PHashTable *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = table->size;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)((int)key + 0x25);
    pPVar3 = pp_hash_table_find_node(table,key,SUB164(auVar2 % auVar1,0));
    if (pPVar3 != (PHashTableNode *)0x0) {
      pPVar3 = (PHashTableNode *)(table->table + (SUB168(auVar2 % auVar1,0) & 0xffffffff));
      pPVar4 = (PHashTableNode *)0x0;
      while (pPVar5 = pPVar4, pPVar3 = pPVar3->next, pPVar3 != (PHashTableNode *)0x0) {
        pPVar4 = pPVar3;
        if (pPVar3->key == key) {
          pPVar4 = (PHashTableNode *)(table->table + (SUB168(auVar2 % auVar1,0) & 0xffffffff));
          if (pPVar5 != (PHashTableNode *)0x0) {
            pPVar4 = pPVar5;
          }
          pPVar4->next = pPVar3->next;
          p_free(pPVar3);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

P_LIB_API void
p_hash_table_remove (PHashTable *table, pconstpointer key)
{
	PHashTableNode	*node;
	PHashTableNode	*prev_node;
	puint		hash;

	if (P_UNLIKELY (table == NULL))
		return;

	hash = pp_hash_table_calc_hash (key, table->size);

	if (pp_hash_table_find_node (table, key, hash) != NULL) {
		node = table->table[hash];
		prev_node = NULL;

		while (node != NULL) {
			if (node->key == key) {
				if (prev_node == NULL)
					table->table[hash] = node->next;
				else
					prev_node->next = node->next;

				p_free (node);
				break;
			} else {
				prev_node = node;
				node = node->next;
			}
		}
	}
}